

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x58) = 5;
  if (*(long *)(in_RDI + 0x38) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x60))();
  }
  moveToParent((TrackerBase *)0x19235a);
  TrackerContext::completeCycle(*(TrackerContext **)(in_RDI + 0x30));
  return;
}

Assistant:

virtual void fail() CATCH_OVERRIDE {
            m_runState = Failed;
            if( m_parent )
                m_parent->markAsNeedingAnotherRun();
            moveToParent();
            m_ctx.completeCycle();
        }